

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnConvertExpr(BinaryReaderIR *this,Opcode opcode)

{
  Result RVar1;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  
  local_20._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x40);
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x12;
  *(undefined ***)
   local_20._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__Expr_0019df38;
  *(Enum *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x3c) = opcode.enum_;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_20);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_20._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnConvertExpr(Opcode opcode) {
  return AppendExpr(std::make_unique<ConvertExpr>(opcode));
}